

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::Start
          (MeshEdgebreakerTraversalValenceDecoder *this,DecoderBuffer *out_buffer)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  char cVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  uint16_t uVar12;
  int64_t iVar13;
  int64_t iVar14;
  size_t sVar15;
  uint num_values;
  bool bVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint32_t num_split_symbols;
  uint32_t num_symbols;
  uint local_48;
  uint local_44;
  vector<int,_std::allocator<int>_> *local_40;
  value_type_conflict1 local_34;
  
  iVar17 = (*((this->super_MeshEdgebreakerTraversalDecoder).decoder_impl_)->
             _vptr_MeshEdgebreakerDecoderImplInterface[8])();
  uVar2 = *(ushort *)(CONCAT44(extraout_var,iVar17) + 0x48);
  if (((ushort)(uVar2 << 8 | uVar2 >> 8) < 0x202) &&
     (bVar16 = MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols
                         (&this->super_MeshEdgebreakerTraversalDecoder), !bVar16)) {
    return false;
  }
  bVar16 = MeshEdgebreakerTraversalDecoder::DecodeStartFaces
                     (&this->super_MeshEdgebreakerTraversalDecoder);
  if (!bVar16) {
    return false;
  }
  bVar16 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams
                     (&this->super_MeshEdgebreakerTraversalDecoder);
  if (!bVar16) {
    return false;
  }
  uVar11 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.field_0x31;
  uVar12 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bitstream_version_;
  out_buffer->bit_mode_ = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_mode_;
  out_buffer->field_0x31 = uVar11;
  out_buffer->bitstream_version_ = uVar12;
  uVar3 = *(undefined4 *)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_;
  uVar4 = *(undefined4 *)((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_ + 4);
  iVar13 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_size_;
  uVar5 = *(undefined4 *)
           ((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_size_ + 4);
  iVar14 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.pos_;
  uVar6 = *(undefined4 *)((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.pos_ + 4);
  uVar7 = *(undefined4 *)
           &(this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_buffer_;
  uVar8 = *(undefined4 *)
           ((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_buffer_ +
           4);
  uVar9 = *(undefined4 *)
           ((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.
                   bit_buffer_end_ + 4);
  sVar15 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_offset_;
  uVar10 = *(undefined4 *)
            ((long)&(this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_offset_ +
            4);
  *(undefined4 *)&(out_buffer->bit_decoder_).bit_buffer_end_ =
       *(undefined4 *)
        &(this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_buffer_end_;
  *(undefined4 *)((long)&(out_buffer->bit_decoder_).bit_buffer_end_ + 4) = uVar9;
  *(int *)&(out_buffer->bit_decoder_).bit_offset_ = (int)sVar15;
  *(undefined4 *)((long)&(out_buffer->bit_decoder_).bit_offset_ + 4) = uVar10;
  *(int *)&out_buffer->pos_ = (int)iVar14;
  *(undefined4 *)((long)&out_buffer->pos_ + 4) = uVar6;
  *(undefined4 *)&(out_buffer->bit_decoder_).bit_buffer_ = uVar7;
  *(undefined4 *)((long)&(out_buffer->bit_decoder_).bit_buffer_ + 4) = uVar8;
  *(undefined4 *)&out_buffer->data_ = uVar3;
  *(undefined4 *)((long)&out_buffer->data_ + 4) = uVar4;
  *(int *)&out_buffer->data_size_ = (int)iVar13;
  *(undefined4 *)((long)&out_buffer->data_size_ + 4) = uVar5;
  iVar17 = (*((this->super_MeshEdgebreakerTraversalDecoder).decoder_impl_)->
             _vptr_MeshEdgebreakerDecoderImplInterface[8])();
  uVar2 = *(ushort *)(CONCAT44(extraout_var_00,iVar17) + 0x48);
  if ((ushort)(uVar2 << 8 | uVar2 >> 8) < 0x202) {
    iVar17 = (*((this->super_MeshEdgebreakerTraversalDecoder).decoder_impl_)->
               _vptr_MeshEdgebreakerDecoderImplInterface[8])();
    if (*(byte *)(CONCAT44(extraout_var_01,iVar17) + 0x48) < 2) {
      lVar19 = out_buffer->pos_ + 4;
      if (out_buffer->data_size_ < lVar19) {
        return false;
      }
      local_48 = *(uint *)(out_buffer->data_ + out_buffer->pos_);
      out_buffer->pos_ = lVar19;
    }
    else {
      bVar16 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_48,out_buffer);
      if (!bVar16) {
        return false;
      }
    }
    if ((uint)this->num_vertices_ <= local_48) {
      return false;
    }
    lVar19 = out_buffer->pos_ + 1;
    if (out_buffer->data_size_ < lVar19) {
      return false;
    }
    cVar1 = out_buffer->data_[out_buffer->pos_];
    out_buffer->pos_ = lVar19;
    if (cVar1 != '\0') {
      return false;
    }
  }
  this->min_valence_ = 2;
  this->max_valence_ = 7;
  if (-1 < (long)this->num_vertices_) {
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->vertex_valences_).vector_,(long)this->num_vertices_,&local_34);
    this_00 = &this->context_symbols_;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(this_00,(long)((this->max_valence_ - this->min_valence_) + 1));
    local_40 = &this->context_counters_;
    std::vector<int,_std::allocator<int>_>::resize
              (local_40,((long)(this->context_symbols_).
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->context_symbols_).
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
    bVar16 = (this->context_symbols_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (this->context_symbols_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar16) {
      return bVar16;
    }
    lVar19 = 0;
    uVar20 = 0;
    while ((bVar16 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_44,out_buffer),
           num_values = local_44, bVar16 &&
           (local_44 <=
            (uint)((ulong)((long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) / 3)))) {
      if (local_44 != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar19),(ulong)local_44);
        DecodeSymbols(num_values,1,out_buffer,
                      *(uint32_t **)
                       ((long)&(((this_00->
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar19));
        (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar20] = num_values;
      }
      uVar20 = uVar20 + 1;
      uVar18 = ((long)(this->context_symbols_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->context_symbols_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar19 = lVar19 + 0x18;
      bVar16 = uVar18 - uVar20 == 0;
      if (uVar18 < uVar20 || bVar16) {
        return uVar18 < uVar20 || bVar16;
      }
    }
  }
  return false;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols()) {
        return false;
      }
    }
#endif
    if (!MeshEdgebreakerTraversalDecoder::DecodeStartFaces()) {
      return false;
    }
    if (!MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams()) {
      return false;
    }
    *out_buffer = *buffer();

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      uint32_t num_split_symbols;
      if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 0)) {
        if (!out_buffer->Decode(&num_split_symbols)) {
          return false;
        }
      } else {
        if (!DecodeVarint(&num_split_symbols, out_buffer)) {
          return false;
        }
      }
      if (num_split_symbols >= static_cast<uint32_t>(num_vertices_)) {
        return false;
      }

      int8_t mode;
      if (!out_buffer->Decode(&mode)) {
        return false;
      }
      if (mode == EDGEBREAKER_VALENCE_MODE_2_7) {
        min_valence_ = 2;
        max_valence_ = 7;
      } else {
        // Unsupported mode.
        return false;
      }

    } else
#endif
    {
      min_valence_ = 2;
      max_valence_ = 7;
    }

    if (num_vertices_ < 0) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);

    const int num_unique_valences = max_valence_ - min_valence_ + 1;

    // Decode all symbols for all contexts.
    context_symbols_.resize(num_unique_valences);
    context_counters_.resize(context_symbols_.size());
    for (int i = 0; i < context_symbols_.size(); ++i) {
      uint32_t num_symbols;
      if (!DecodeVarint<uint32_t>(&num_symbols, out_buffer)) {
        return false;
      }
      if (num_symbols > static_cast<uint32_t>(corner_table_->num_faces())) {
        return false;
      }
      if (num_symbols > 0) {
        context_symbols_[i].resize(num_symbols);
        DecodeSymbols(num_symbols, 1, out_buffer, context_symbols_[i].data());
        // All symbols are going to be processed from the back.
        context_counters_[i] = num_symbols;
      }
    }
    return true;
  }